

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void triangle(vec2i *pts,TGAImage *image,TGAColor color)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t i;
  long lVar4;
  vec2i P;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  vec3f bc_screen;
  ulong local_80;
  TGAColor local_78 [2];
  int local_6c;
  vec2i *local_68;
  long local_60;
  size_t local_58;
  TGAImage *local_50;
  vec3f local_48;
  
  local_78[0].bgra = color.bgra;
  local_78[0].bytespp = color.bytespp;
  local_68 = pts;
  sVar2 = TGAImage::get_width(image);
  iVar8 = (int)sVar2 + -1;
  sVar2 = TGAImage::get_height(image);
  iVar11 = (int)sVar2 + -1;
  sVar2 = TGAImage::get_width(image);
  local_50 = image;
  sVar3 = TGAImage::get_height(image);
  iVar10 = 0;
  iVar9 = 0;
  lVar4 = 0;
  do {
    lVar5 = 1;
    do {
      bVar12 = lVar5 != 1;
      iVar1 = (&local_68[lVar4].x)[bVar12];
      iVar6 = iVar9;
      if (!bVar12) {
        iVar6 = iVar10;
      }
      iVar7 = (int)sVar3;
      if (!bVar12) {
        iVar7 = (int)sVar2;
      }
      if (iVar6 < iVar1) {
        iVar6 = iVar1;
      }
      if (iVar7 + -1 <= iVar6) {
        iVar6 = iVar7 + -1;
      }
      iVar7 = iVar8;
      if (lVar5 != 1) {
        iVar9 = iVar6;
        iVar7 = iVar11;
        iVar6 = iVar10;
      }
      iVar10 = iVar6;
      if (iVar1 < iVar7) {
        iVar7 = iVar1;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (lVar5 != 1) {
        iVar11 = iVar7;
        iVar7 = iVar8;
      }
      iVar8 = iVar7;
      lVar5 = lVar5 + -1;
    } while (lVar5 == 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (iVar8 <= iVar10) {
    local_58 = (size_t)iVar11;
    local_80 = (ulong)iVar8;
    local_60 = local_58 << 0x20;
    local_6c = (iVar9 - iVar11) + 1;
    do {
      if (iVar11 <= iVar9) {
        P = (vec2i)((local_80 & 0xffffffff) + local_60);
        sVar2 = local_58;
        iVar8 = local_6c;
        do {
          barycentric(&local_48,local_68,P);
          if (((0.0 <= local_48.x) && (0.0 <= local_48.y)) && (0.0 <= local_48.z)) {
            TGAImage::set(local_50,local_80,sVar2,local_78);
          }
          sVar2 = sVar2 + 1;
          P = (vec2i)((long)P + 0x100000000);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      local_80 = local_80 + 1;
    } while (iVar10 + 1 != (int)local_80);
  }
  return;
}

Assistant:

void triangle(vec2i *pts, TGAImage &image, TGAColor color)
{
    vec2i bboxmin(image.get_width() - 1, image.get_height() - 1);
    vec2i bboxmax(0, 0);
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (size_t i = 0; i < 3; i++) {
        for (size_t j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec2i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts, P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
        }
    }
}